

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall kj::ReadableDirectory::lstat(ReadableDirectory *this,char *__file,stat *__buf)

{
  NullableValue<kj::FsNode::Metadata> *other;
  Metadata *pMVar1;
  undefined8 in_RCX;
  Fault local_d0;
  Fault f;
  Metadata *meta;
  Maybe<kj::FsNode::Metadata> local_90;
  undefined1 local_58 [8];
  NullableValue<kj::FsNode::Metadata> _meta543;
  ReadableDirectory *this_local;
  PathPtr path_local;
  
  _meta543.field_1.value.hashCode = (uint64_t)__file;
  this_local = (ReadableDirectory *)__buf;
  (**(code **)(*(long *)__file + 0x48))(&local_90,__file,__buf,in_RCX);
  other = kj::_::readMaybe<kj::FsNode::Metadata>(&local_90);
  kj::_::NullableValue<kj::FsNode::Metadata>::NullableValue
            ((NullableValue<kj::FsNode::Metadata> *)local_58,other);
  Maybe<kj::FsNode::Metadata>::~Maybe(&local_90);
  pMVar1 = kj::_::NullableValue::operator_cast_to_Metadata_((NullableValue *)local_58);
  if (pMVar1 == (Metadata *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x222,FAILED,(char *)0x0,"\"no such file or directory\", path",
               (char (*) [26])"no such file or directory",(PathPtr *)&this_local);
    f.exception._4_4_ = 2;
    kj::_::Debug::Fault::~Fault(&local_d0);
    memset(this,0,0x30);
    FsNode::Metadata::Metadata((Metadata *)this);
  }
  else {
    pMVar1 = kj::_::NullableValue<kj::FsNode::Metadata>::operator*
                       ((NullableValue<kj::FsNode::Metadata> *)local_58);
    memcpy(this,pMVar1,0x30);
  }
  f.exception._4_4_ = 1;
  kj::_::NullableValue<kj::FsNode::Metadata>::~NullableValue
            ((NullableValue<kj::FsNode::Metadata> *)local_58);
  return (int)this;
}

Assistant:

FsNode::Metadata ReadableDirectory::lstat(PathPtr path) const {
  KJ_IF_SOME(meta, tryLstat(path)) {
    return meta;
  } else {
    KJ_FAIL_REQUIRE("no such file or directory", path) { break; }